

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_K256_ECDSA.c
# Opt level: O0

void point_mul_g(uint64_t *out,uint64_t *scalar)

{
  uint64_t *b;
  uint64_t *b_00;
  uint64_t *b_01;
  uint64_t uVar1;
  uint64_t bits_l2_15;
  uint32_t k2_15;
  uint64_t bits_l1_15;
  uint32_t k1_15;
  uint64_t bits_l0_15;
  uint32_t k0_15;
  uint64_t bits_l_15;
  uint32_t k_15;
  uint32_t i0_15;
  uint64_t bits_l2_14;
  uint32_t k2_14;
  uint64_t bits_l1_14;
  uint32_t k1_14;
  uint64_t bits_l0_14;
  uint32_t k0_14;
  uint64_t bits_l_14;
  uint32_t k_14;
  uint32_t i0_14;
  uint64_t bits_l2_13;
  uint32_t k2_13;
  uint64_t bits_l1_13;
  uint32_t k1_13;
  uint64_t bits_l0_13;
  uint32_t k0_13;
  uint64_t bits_l_13;
  uint32_t k_13;
  uint32_t i0_13;
  uint64_t bits_l2_12;
  uint32_t k2_12;
  uint64_t bits_l1_12;
  uint32_t k1_12;
  uint64_t bits_l0_12;
  uint32_t k0_12;
  uint64_t bits_l_12;
  uint32_t k_12;
  uint32_t i0_12;
  uint64_t bits_l2_11;
  uint32_t k2_11;
  uint64_t bits_l1_11;
  uint32_t k1_11;
  uint64_t bits_l0_11;
  uint32_t k0_11;
  uint64_t bits_l_11;
  uint32_t k_11;
  uint32_t i0_11;
  uint64_t bits_l2_10;
  uint32_t k2_10;
  uint64_t bits_l1_10;
  uint32_t k1_10;
  uint64_t bits_l0_10;
  uint32_t k0_10;
  uint64_t bits_l_10;
  uint32_t k_10;
  uint32_t i0_10;
  uint64_t bits_l2_9;
  uint32_t k2_9;
  uint64_t bits_l1_9;
  uint32_t k1_9;
  uint64_t bits_l0_9;
  uint32_t k0_9;
  uint64_t bits_l_9;
  uint32_t k_9;
  uint32_t i0_9;
  uint64_t bits_l2_8;
  uint32_t k2_8;
  uint64_t bits_l1_8;
  uint32_t k1_8;
  uint64_t bits_l0_8;
  uint32_t k0_8;
  uint64_t bits_l_8;
  uint32_t k_8;
  uint32_t i0_8;
  uint64_t bits_l2_7;
  uint32_t k2_7;
  uint64_t bits_l1_7;
  uint32_t k1_7;
  uint64_t bits_l0_7;
  uint32_t k0_7;
  uint64_t bits_l_7;
  uint32_t k_7;
  uint32_t i0_7;
  uint64_t bits_l2_6;
  uint32_t k2_6;
  uint64_t bits_l1_6;
  uint32_t k1_6;
  uint64_t bits_l0_6;
  uint32_t k0_6;
  uint64_t bits_l_6;
  uint32_t k_6;
  uint32_t i0_6;
  uint64_t bits_l2_5;
  uint32_t k2_5;
  uint64_t bits_l1_5;
  uint32_t k1_5;
  uint64_t bits_l0_5;
  uint32_t k0_5;
  uint64_t bits_l_5;
  uint32_t k_5;
  uint32_t i0_5;
  uint64_t bits_l2_4;
  uint32_t k2_4;
  uint64_t bits_l1_4;
  uint32_t k1_4;
  uint64_t bits_l0_4;
  uint32_t k0_4;
  uint64_t bits_l_4;
  uint32_t k_4;
  uint32_t i0_4;
  uint64_t bits_l2_3;
  uint32_t k2_3;
  uint64_t bits_l1_3;
  uint32_t k1_3;
  uint64_t bits_l0_3;
  uint32_t k0_3;
  uint64_t bits_l_3;
  uint32_t k_3;
  uint32_t i0_3;
  uint64_t bits_l2_2;
  uint32_t k2_2;
  uint64_t bits_l1_2;
  uint32_t k1_2;
  uint64_t bits_l0_2;
  uint32_t k0_2;
  uint64_t bits_l_2;
  uint32_t k_2;
  uint32_t i0_2;
  uint64_t bits_l2_1;
  uint32_t k2_1;
  uint64_t bits_l1_1;
  uint32_t k1_1;
  uint64_t bits_l0_1;
  uint32_t k0_1;
  uint64_t bits_l_1;
  uint32_t k_1;
  uint32_t i0_1;
  uint64_t bits_l2;
  uint32_t k2;
  uint64_t bits_l1;
  uint32_t k1;
  uint64_t bits_l0;
  uint32_t k0;
  uint64_t bits_l;
  uint32_t k;
  uint32_t i0;
  uint32_t i;
  uint64_t tmp [15];
  uint64_t *r4;
  uint64_t *r3;
  uint64_t *r2;
  uint64_t *r1;
  uint64_t q4 [15];
  undefined1 local_1a8 [8];
  uint64_t q3 [15];
  undefined1 local_128 [8];
  uint64_t q2 [15];
  uint64_t *gz;
  uint64_t *gy;
  uint64_t *gx;
  uint64_t q1 [15];
  uint64_t *scalar_local;
  uint64_t *out_local;
  
  memset(&gx,0,0x78);
  q2[0xe] = (uint64_t)(q1 + 9);
  gx = (uint64_t *)0x2815b16f81798;
  q1[0] = 0xdb2dce28d959f;
  q1[1] = 0xe870b07029bfc;
  q1[2] = 0xbbac55a06295c;
  q1[3] = 0x79be667ef9dc;
  q1[4] = 0x7d08ffb10d4b8;
  q1[5] = 0x48a68554199c4;
  q1[6] = 0xe1108a8fd17b4;
  q1[7] = 0xc4655da4fbfc0;
  q1[8] = 0x483ada7726a3;
  memset((void *)q2[0xe],0,0x28);
  *(undefined8 *)q2[0xe] = 1;
  memcpy(local_128,&DAT_0053d300,0x78);
  memcpy(local_1a8,&DAT_0053d380,0x78);
  memcpy(&r1,&DAT_0053d400,0x78);
  b = scalar + 1;
  b_00 = scalar + 2;
  b_01 = scalar + 3;
  Hacl_Impl_K256_Point_make_point_at_inf(out);
  memset(&i0,0,0x78);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x3c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x3c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x3c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x3c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x38,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x38,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x38,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x38,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x34,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x34,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x34,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x34,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x30,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x30,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x30,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x30,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x2c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x2c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x2c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x2c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x28,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x28,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x28,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x28,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x24,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x24,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x24,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x24,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x20,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x20,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x20,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x20,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x1c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x1c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x1c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x1c,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x18,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x18,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x18,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x18,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x14,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x14,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x14,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x14,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0x10,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0x10,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0x10,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0x10,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0xc,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0xc,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0xc,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0xc,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,8,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,8,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,8,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,8,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,4,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,4,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,4,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,4,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  Hacl_Impl_K256_PointDouble_point_double(out,out);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_01,0,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b_00,0,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,b,0,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  uVar1 = Hacl_Bignum_Lib_bn_get_bits_u64(1,scalar,0,4);
  precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4,uVar1,(uint64_t *)&i0);
  Hacl_Impl_K256_PointAdd_point_add(out,out,(uint64_t *)&i0);
  return;
}

Assistant:

static inline void point_mul_g(uint64_t *out, uint64_t *scalar)
{
  uint64_t q1[15U] = { 0U };
  uint64_t *gx = q1;
  uint64_t *gy = q1 + 5U;
  uint64_t *gz = q1 + 10U;
  gx[0U] = 0x2815b16f81798ULL;
  gx[1U] = 0xdb2dce28d959fULL;
  gx[2U] = 0xe870b07029bfcULL;
  gx[3U] = 0xbbac55a06295cULL;
  gx[4U] = 0x79be667ef9dcULL;
  gy[0U] = 0x7d08ffb10d4b8ULL;
  gy[1U] = 0x48a68554199c4ULL;
  gy[2U] = 0xe1108a8fd17b4ULL;
  gy[3U] = 0xc4655da4fbfc0ULL;
  gy[4U] = 0x483ada7726a3ULL;
  memset(gz, 0U, 5U * sizeof (uint64_t));
  gz[0U] = 1ULL;
  uint64_t
  q2[15U] =
    {
      4496295042185355ULL, 3125448202219451ULL, 1239608518490046ULL, 2687445637493112ULL,
      77979604880139ULL, 3360310474215011ULL, 1216410458165163ULL, 177901593587973ULL,
      3209978938104985ULL, 118285133003718ULL, 434519962075150ULL, 1114612377498854ULL,
      3488596944003813ULL, 450716531072892ULL, 66044973203836ULL
    };
  KRML_MAYBE_UNUSED_VAR(q2);
  uint64_t
  q3[15U] =
    {
      1277614565900951ULL, 378671684419493ULL, 3176260448102880ULL, 1575691435565077ULL,
      167304528382180ULL, 2600787765776588ULL, 7497946149293ULL, 2184272641272202ULL,
      2200235265236628ULL, 265969268774814ULL, 1913228635640715ULL, 2831959046949342ULL,
      888030405442963ULL, 1817092932985033ULL, 101515844997121ULL
    };
  KRML_MAYBE_UNUSED_VAR(q3);
  uint64_t
  q4[15U] =
    {
      34056422761564ULL, 3315864838337811ULL, 3797032336888745ULL, 2580641850480806ULL,
      208048944042500ULL, 1233795288689421ULL, 1048795233382631ULL, 646545158071530ULL,
      1816025742137285ULL, 12245672982162ULL, 2119364213800870ULL, 2034960311715107ULL,
      3172697815804487ULL, 4185144850224160ULL, 2792055915674ULL
    };
  KRML_MAYBE_UNUSED_VAR(q4);
  uint64_t *r1 = scalar;
  uint64_t *r2 = scalar + 1U;
  uint64_t *r3 = scalar + 2U;
  uint64_t *r4 = scalar + 3U;
  Hacl_Impl_K256_Point_make_point_at_inf(out);
  uint64_t tmp[15U] = { 0U };
  KRML_MAYBE_FOR16(i,
    0U,
    16U,
    1U,
    KRML_MAYBE_FOR4(i0, 0U, 4U, 1U, Hacl_Impl_K256_PointDouble_point_double(out, out););
    uint32_t k = 64U - 4U * i - 4U;
    uint64_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r4, k, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_192_table_w4, bits_l, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp);
    uint32_t k0 = 64U - 4U * i - 4U;
    uint64_t bits_l0 = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r3, k0, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_128_table_w4, bits_l0, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp);
    uint32_t k1 = 64U - 4U * i - 4U;
    uint64_t bits_l1 = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r2, k1, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_g_pow2_64_table_w4, bits_l1, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp);
    uint32_t k2 = 64U - 4U * i - 4U;
    uint64_t bits_l2 = Hacl_Bignum_Lib_bn_get_bits_u64(1U, r1, k2, 4U);
    precomp_get_consttime(Hacl_K256_PrecompTable_precomp_basepoint_table_w4, bits_l2, tmp);
    Hacl_Impl_K256_PointAdd_point_add(out, out, tmp););
}